

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::SpecializeLoop
          (LoopUnswitch *this,Loop *loop,Instruction *to_version_insn,Instruction *cst_value)

{
  uint uVar1;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *inst;
  pointer pOVar2;
  undefined8 *puVar3;
  array<signed_char,_4UL> aVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  use_list;
  _Any_data local_a0;
  PodType local_90;
  PodType PStack_8c;
  code **local_88;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  Instruction *local_78;
  DefUseManager *local_70;
  undefined8 *local_68;
  undefined8 *puStack_60;
  long local_58;
  Loop *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  this_00 = this->context_;
  local_78 = to_version_insn;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_48 = 0;
  local_40 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:457:19)>
             ::_M_manager;
  local_38 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:457:19)>
             ::_M_invoke;
  local_58 = 0;
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_a0._8_8_ = 0;
  local_50 = loop;
  local_a0._M_unused._M_object = operator_new(0x18);
  *(undefined8 ***)local_a0._M_unused._0_8_ = &local_68;
  *(Loop ***)((long)local_a0._M_unused._0_8_ + 8) = &local_50;
  *(LoopUnswitch **)((long)local_a0._M_unused._0_8_ + 0x10) = this;
  local_88 = (code **)std::
                      _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:461:29)>
                      ::_M_invoke;
  _local_90 = std::
              _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:461:29)>
              ::_M_manager;
  local_70 = this_01;
  analysis::DefUseManager::ForEachUse
            (this_01,local_78,
             (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_a0);
  if ((PodType  [2])_local_90 != (PodType  [2])0x0) {
    (*_local_90)(&local_a0,&local_a0,3);
  }
  puVar3 = puStack_60;
  if (local_68 != puStack_60) {
    puVar8 = local_68;
    if (cst_value == (Instruction *)0x0) {
      __assert_fail("cst_value && \"We do not have a value to use.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                    ,0x1e3,
                    "void spvtools::opt::(anonymous namespace)::LoopUnswitch::SpecializeLoop(Loop *, Instruction *, Instruction *)"
                   );
    }
    do {
      uVar1 = *(uint *)(puVar8 + 1);
      uVar7 = (ulong)uVar1;
      inst = (Instruction *)*puVar8;
      aVar4._M_elems[0] = '\0';
      aVar4._M_elems[1] = '\0';
      aVar4._M_elems[2] = '\0';
      aVar4._M_elems[3] = '\0';
      if (cst_value->has_result_id_ != false) {
        aVar4._M_elems =
             (_Type)Instruction::GetSingleWordOperand(cst_value,(uint)cst_value->has_type_id_);
      }
      local_a0._M_unused._M_object = &PTR__SmallVector_00930a20;
      local_88 = (code **)&local_90;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_90.data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)aVar4._M_elems;
      local_a0._8_8_ = 1;
      pOVar2 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
              -0x5555555555555555;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      uVar6 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar6 = (uint)inst->has_result_id_;
      }
      if (uVar1 < uVar6) {
        __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b9,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&pOVar2[uVar7].words,(SmallVector<unsigned_int,_2UL> *)&local_a0);
      local_a0._M_unused._M_object = &PTR__SmallVector_00930a20;
      if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80._M_head_impl);
      }
      analysis::DefUseManager::AnalyzeInstUse(local_70,inst);
      puVar8 = puVar8 + 2;
    } while (puVar8 != puVar3);
  }
  if (local_68 != (undefined8 *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return;
}

Assistant:

void SpecializeLoop(Loop* loop, Instruction* to_version_insn,
                      Instruction* cst_value) {
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    std::function<bool(uint32_t)> ignore_node;
    ignore_node = [loop](uint32_t bb_id) { return !loop->IsInsideLoop(bb_id); };

    std::vector<std::pair<Instruction*, uint32_t>> use_list;
    def_use_mgr->ForEachUse(to_version_insn,
                            [&use_list, &ignore_node, this](
                                Instruction* inst, uint32_t operand_index) {
                              BasicBlock* bb = context_->get_instr_block(inst);

                              if (!bb || ignore_node(bb->id())) {
                                // Out of the loop, the specialization does not
                                // apply any more.
                                return;
                              }
                              use_list.emplace_back(inst, operand_index);
                            });

    // First pass: inject the specialized value into the loop (and only the
    // loop).
    for (auto use : use_list) {
      Instruction* inst = use.first;
      uint32_t operand_index = use.second;

      // To also handle switch, cst_value can be nullptr: this case
      // means that we are looking to branch to the default target of
      // the switch. We don't actually know its value so we don't touch
      // it if it not a switch.
      assert(cst_value && "We do not have a value to use.");
      inst->SetOperand(operand_index, {cst_value->result_id()});
      def_use_mgr->AnalyzeInstUse(inst);
    }
  }